

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

void fillInHeader(header_old_cpio *header,stat *st,string *filename)

{
  short sVar1;
  ushort uVar2;
  CpioException *this;
  allocator<char> local_41;
  string local_40;
  string *local_20;
  string *filename_local;
  stat *st_local;
  header_old_cpio *header_local;
  
  header->c_magic = 0x71c7;
  header->c_dev = (unsigned_short)st->st_dev;
  header->c_ino = (unsigned_short)st->st_ino;
  header->c_mode = (unsigned_short)st->st_mode;
  header->c_uid = (unsigned_short)st->st_uid;
  header->c_gid = (unsigned_short)st->st_gid;
  header->c_nlink = (unsigned_short)st->st_nlink;
  header->c_rdev = (unsigned_short)st->st_rdev;
  header->c_mtime[0] = *(unsigned_short *)((long)&(st->st_mtim).tv_sec + 2);
  header->c_mtime[1] = (unsigned_short)(st->st_mtim).tv_sec;
  local_20 = filename;
  filename_local = (string *)st;
  st_local = (stat *)header;
  sVar1 = std::__cxx11::string::length();
  *(short *)((long)&st_local->st_nlink + 4) = sVar1 + 1;
  uVar2 = *(ushort *)((long)&st_local->st_dev + 6) & 0xf000;
  if ((((uVar2 != 0x1000) && (uVar2 != 0x2000)) && (uVar2 != 0x4000)) && (uVar2 != 0x6000)) {
    if ((uVar2 == 0x8000) || (uVar2 == 0xa000)) {
      *(short *)((long)&st_local->st_nlink + 6) =
           (short)(filename_local[1].field_2._M_allocated_capacity >> 0x10);
      *(short *)&st_local->st_mode = (short)filename_local[1].field_2._M_allocated_capacity;
      return;
    }
    if (uVar2 != 0xc000) {
      this = (CpioException *)__cxa_allocate_exception(0x18);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_40,"Unknown filetype",&local_41);
      CpioException::CpioException(this,InvalidInputFileToArchive,&local_40);
      __cxa_throw(this,&CpioException::typeinfo,CpioException::~CpioException);
    }
  }
  *(undefined2 *)((long)&st_local->st_nlink + 6) = 0;
  *(undefined2 *)&st_local->st_mode = 0;
  return;
}

Assistant:

void fillInHeader(header_old_cpio& header, struct stat& st, const string& filename)
{
	header.c_magic = 0x71c7;
	header.c_dev = (unsigned short) st.st_dev;
	header.c_ino = (unsigned short) st.st_ino;
	header.c_mode = (unsigned short) st.st_mode;
	header.c_uid = (unsigned short) st.st_uid;
	header.c_gid = (unsigned short) st.st_gid;
	header.c_nlink = (unsigned short) st.st_nlink;
	header.c_rdev = (unsigned short) st.st_rdev;
	header.c_mtime[0] = (unsigned short) (st.st_mtime >> sizeof(unsigned short)*8);
	header.c_mtime[1] = (unsigned short) (st.st_mtime);
	header.c_namesize = (unsigned short) (filename.length() + 1);
	switch (header.c_mode & CP_IFMT) {
	    case S_IFDIR:
		case S_IFCHR:
	    case S_IFBLK:
	    case S_IFSOCK:
	    case S_IFIFO:
	    	header.c_filesize[0] = 0;
	    	header.c_filesize[1] = 0;
	    	break;
	    case S_IFLNK:
	    case S_IFREG:
			header.c_filesize[0] = (unsigned short) (st.st_size >> sizeof(unsigned short)*8); // for filesizes <= 2Gb
			header.c_filesize[1] = (unsigned short) (st.st_size);
			break;
		default:
			throw CpioException(CpioException::InvalidInputFileToArchive, "Unknown filetype");
	}
}